

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

void mp_next(char **data)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  int64_t k;
  long lVar4;
  
  k = 1;
  pbVar3 = (byte *)*data;
  do {
    if (k < 1) {
      return;
    }
    bVar1 = *pbVar3;
    pbVar2 = pbVar3 + 1;
    *data = (char *)pbVar2;
    lVar4 = (long)""[bVar1];
    if (lVar4 < 0) {
      if (bVar1 == 0xd9) {
        pbVar2 = pbVar3 + (ulong)pbVar3[1] + 2;
        goto LAB_00129f14;
      }
      if ((byte)""[bVar1] < 0xe1) {
        *data = (char *)pbVar3;
        mp_next_slowpath(data,k);
        return;
      }
      k = k - lVar4;
    }
    else {
      pbVar2 = pbVar2 + lVar4;
LAB_00129f14:
      *data = (char *)pbVar2;
    }
    k = k + -1;
    pbVar3 = pbVar2;
  } while( true );
}

Assistant:

MP_IMPL void
mp_next(const char **data)
{
	int64_t k = 1;
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			*data += l;
			continue;
		} else if (mp_likely(c == 0xd9)){
			/* MP_STR (8) */
			uint8_t len = mp_load_u8(data);
			*data += len;
			continue;
		} else if (l > MP_HINT) {
			k -= l;
			continue;
		} else {
			*data -= sizeof(uint8_t);
			mp_next_slowpath(data, k);
			return;
		}
	}
}